

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall
baseObject::drawParametricEquation
          (baseObject *this,_func_point_double *func,range *_rangeT,int cDivSteps)

{
  pointer *pp_Var1;
  pointer *ppbVar2;
  iterator __position;
  iterator __position_00;
  size_t i;
  ulong uVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  point pVar7;
  point pt;
  point local_b8;
  double local_a8;
  double local_a0;
  double local_98;
  double dStack_90;
  vector<bezierPoint,std::allocator<bezierPoint>> *local_88;
  vector<_point,std::allocator<_point>> *local_80;
  double local_78;
  double local_70;
  bezierPoint local_68;
  
  local_78 = (_rangeT->max - _rangeT->min) / (double)cDivSteps;
  local_68.pt[2].x = 0.0;
  local_68.pt[2].y = 0.0;
  local_68.pt[1].x = 0.0;
  local_68.pt[1].y = 0.0;
  local_68.pt[0].x = 0.0;
  local_68.pt[0].y = 0.0;
  local_a0 = local_78 / 3.0;
  local_80 = (vector<_point,std::allocator<_point>> *)&this->points;
  local_88 = (vector<bezierPoint,std::allocator<bezierPoint>> *)&this->curves;
  uVar3 = 0;
  do {
    auVar6._8_4_ = (int)(uVar3 >> 0x20);
    auVar6._0_8_ = uVar3;
    auVar6._12_4_ = 0x45300000;
    dStack_90 = auVar6._8_8_ - 1.9342813113834067e+25;
    local_98 = (dStack_90 + ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) *
               local_78 + _rangeT->min;
    local_b8 = (*func)(local_98);
    __position._M_current =
         (this->points).super__Vector_base<_point,_std::allocator<_point>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->points).super__Vector_base<_point,_std::allocator<_point>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<_point,std::allocator<_point>>::_M_realloc_insert<_point_const&>
                (local_80,__position,&local_b8);
    }
    else {
      (__position._M_current)->x = local_b8.x;
      (__position._M_current)->y = local_b8.y;
      pp_Var1 = &(this->points).super__Vector_base<_point,_std::allocator<_point>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *pp_Var1 = *pp_Var1 + 1;
    }
    dVar5 = (this->rangeX).min;
    dVar4 = local_b8.x;
    if (dVar5 <= local_b8.x) {
      dVar4 = dVar5;
    }
    (this->rangeX).min = dVar4;
    dVar5 = (this->rangeX).max;
    dVar4 = local_b8.x;
    if (local_b8.x <= dVar5) {
      dVar4 = dVar5;
    }
    (this->rangeX).max = dVar4;
    dVar5 = (this->rangeY).min;
    dVar4 = local_b8.y;
    if (dVar5 <= local_b8.y) {
      dVar4 = dVar5;
    }
    (this->rangeY).min = dVar4;
    dVar5 = (this->rangeY).max;
    dVar4 = local_b8.y;
    if (local_b8.y <= dVar5) {
      dVar4 = dVar5;
    }
    (this->rangeY).max = dVar4;
    pVar7 = (*func)(local_98 - local_a0);
    local_70 = pVar7.y;
    local_a8 = pVar7.x;
    pVar7 = (*func)(local_98 + local_a0);
    dVar5 = (pVar7.y - local_70) * 0.5;
    local_98 = (pVar7.x - local_a8) * 0.5;
    local_68.pt[1].x = local_b8.x - local_98;
    local_68.pt[1].y = local_b8.y - dVar5;
    local_68.pt[2].x = local_b8.x;
    local_68.pt[2].y = local_b8.y;
    if (uVar3 != 0) {
      __position_00._M_current =
           (this->curves).super__Vector_base<bezierPoint,_std::allocator<bezierPoint>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this->curves).super__Vector_base<bezierPoint,_std::allocator<bezierPoint>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        local_a8 = dVar5;
        std::vector<bezierPoint,std::allocator<bezierPoint>>::_M_realloc_insert<bezierPoint_const&>
                  (local_88,__position_00,&local_68);
        dVar5 = local_a8;
      }
      else {
        (__position_00._M_current)->pt[2].x = local_b8.x;
        (__position_00._M_current)->pt[2].y = local_b8.y;
        (__position_00._M_current)->pt[1].x = local_68.pt[1].x;
        (__position_00._M_current)->pt[1].y = local_68.pt[1].y;
        (__position_00._M_current)->pt[0].x = local_68.pt[0].x;
        (__position_00._M_current)->pt[0].y = local_68.pt[0].y;
        ppbVar2 = &(this->curves).super__Vector_base<bezierPoint,_std::allocator<bezierPoint>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppbVar2 = *ppbVar2 + 1;
      }
    }
    local_68.pt[0].x = local_98 + local_b8.x;
    local_68.pt[0].y = dVar5 + local_b8.y;
    uVar3 = uVar3 + 1;
  } while (uVar3 <= (ulong)(long)cDivSteps);
  return;
}

Assistant:

void drawParametricEquation(point (*func)(double), const range& _rangeT, const int cDivSteps)
    {
        double cStep = _rangeT.getSpan() / cDivSteps;
        //rangeX = _rangeX;

        // for differentials
        bezierPoint dPoint;
        double dStep = cStep / 3.;

        for (size_t i = 0; i <= cDivSteps; i++)
        {
            double t = _rangeT.min + i * cStep;
            point pt = func(t);
            points.push_back(pt);

            // check the range of Y
            rangeX.min = pt.x < rangeX.min ? pt.x : rangeX.min;
            rangeX.max = pt.x > rangeX.max ? pt.x : rangeX.max;
            rangeY.min = pt.y < rangeY.min ? pt.y : rangeY.min;
            rangeY.max = pt.y > rangeY.max ? pt.y : rangeY.max;

            // compute differentials
            point diff[] = { func(t - dStep), func(t + dStep) };
            double slope = (diff[1].y - diff[0].y) / 2.;
            double xStep = (diff[1].x - diff[0].x) / 2.;
            dPoint.pt[1] = point(pt.x - xStep, pt.y - slope);
            dPoint.pt[2] = pt;
            if (i != 0)
            { // skip first iteration
                curves.push_back(dPoint);
            }
            dPoint.pt[0] = point(pt.x + xStep, pt.y + slope);
        }
    }